

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall
helics::FederateState::FederateState(FederateState *this,string *fedName,CoreFederateInfo *fedInfo)

{
  bool bVar1;
  int iVar2;
  pointer this_00;
  long in_RDX;
  long in_RDI;
  long lVar3;
  FederateState *this_01;
  int in_stack_00000044;
  FederateState *in_stack_00000048;
  Time in_stack_00000050;
  pair<int,_bool> *prop_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *__range1_2;
  pair<int,_int> *prop_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1_1;
  pair<int,_TimeRepresentation<count_time<9,_long>_>_> *prop;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  *__range1;
  undefined6 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5e;
  undefined1 in_stack_fffffffffffffe5f;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffe68;
  FederateState *in_stack_fffffffffffffe70;
  InterfaceInfo *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  TimeCoordinator *in_stack_fffffffffffffea0;
  function<void_(helics::ActionMessage_&&)> local_e0;
  reference local_c0;
  pair<int,_bool> *local_b8;
  __normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
  local_b0;
  long local_a8;
  reference local_a0;
  pair<int,_int> *local_98;
  __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_90;
  long local_88;
  baseType local_80;
  reference local_78;
  pair<int,_TimeRepresentation<count_time<9,_long>_>_> *local_70;
  __normal_iterator<const_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_*,_std::vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>_>
  local_68;
  long local_60;
  GlobalFederateId local_58;
  undefined1 local_51;
  long local_18;
  
  local_18 = in_RDX;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  operator_new(0x268);
  local_51 = 1;
  std::function<void(helics::ActionMessage_const&)>::
  function<helics::FederateState::FederateState(std::__cxx11::string_const&,helics::CoreFederateInfo_const&)::__0,void>
            ((function<void_(const_helics::ActionMessage_&)> *)in_stack_fffffffffffffe70,
             in_stack_fffffffffffffe68);
  TimeCoordinator::TimeCoordinator
            (in_stack_fffffffffffffea0,
             (function<void_(const_helics::ActionMessage_&)> *)in_stack_fffffffffffffe98);
  local_51 = 0;
  std::unique_ptr<helics::TimeCoordinator,std::default_delete<helics::TimeCoordinator>>::
  unique_ptr<std::default_delete<helics::TimeCoordinator>,void>
            ((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_> *)
             CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (pointer)CONCAT17(in_stack_fffffffffffffe5f,
                               CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)));
  CLI::std::function<void_(const_helics::ActionMessage_&)>::~function
            ((function<void_(const_helics::ActionMessage_&)> *)0x59ec35);
  LocalFederateId::LocalFederateId((LocalFederateId *)(in_RDI + 0x28));
  local_58.gid = 0;
  GlobalFederateId::GlobalFederateId(&local_58);
  std::atomic<helics::GlobalFederateId>::atomic
            ((atomic<helics::GlobalFederateId> *)(in_RDI + 0x2c),local_58);
  std::atomic<helics::FederateStates>::atomic
            ((atomic<helics::FederateStates> *)(in_RDI + 0x30),CREATED);
  *(undefined1 *)(in_RDI + 0x31) = 0;
  *(undefined1 *)(in_RDI + 0x32) = 0;
  *(undefined1 *)(in_RDI + 0x33) = 0;
  *(undefined1 *)(in_RDI + 0x34) = 0;
  *(undefined1 *)(in_RDI + 0x35) = 0;
  *(undefined1 *)(in_RDI + 0x36) = 0;
  *(undefined1 *)(in_RDI + 0x37) = 0;
  *(undefined1 *)(in_RDI + 0x38) = 0;
  *(undefined1 *)(in_RDI + 0x39) = 0;
  *(undefined1 *)(in_RDI + 0x3a) = 1;
  InterfaceInfo::InterfaceInfo(in_stack_fffffffffffffe80);
  std::make_unique<helics::LogManager>();
  *(undefined4 *)(in_RDI + 0x290) = 0xfffffffc;
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (bool)in_stack_fffffffffffffe5f);
  *(undefined4 *)(in_RDI + 0x298) = 0;
  *(undefined1 *)(in_RDI + 0x29c) = 0;
  *(undefined1 *)(in_RDI + 0x29d) = 0;
  *(undefined1 *)(in_RDI + 0x29e) = 0;
  *(undefined1 *)(in_RDI + 0x29f) = 0;
  *(undefined4 *)(in_RDI + 0x2a0) = 0;
  *(undefined8 *)(in_RDI + 0x2a8) = 0;
  std::__cxx11::string::string(&in_stack_fffffffffffffe70->name);
  CLI::std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  *(undefined8 *)(in_RDI + 0x2d8) = 0;
  *(undefined8 *)(in_RDI + 0x2e0) = 0;
  *(undefined8 *)(in_RDI + 0x2e8) = 0;
  *(undefined4 *)(in_RDI + 0x2f0) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x2f4) = 0xffffffff;
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (bool)in_stack_fffffffffffffe5f);
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (bool)in_stack_fffffffffffffe5f);
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (bool)in_stack_fffffffffffffe5f);
  *(undefined1 *)(in_RDI + 0x2fb) = 0;
  *(undefined1 *)(in_RDI + 0x2fc) = 0;
  *(undefined1 *)(in_RDI + 0x2fd) = 0;
  *(undefined1 *)(in_RDI + 0x2fe) = 0;
  *(undefined1 *)(in_RDI + 0x2ff) = 0;
  *(undefined4 *)(in_RDI + 0x300) = 0;
  std::shared_ptr<helics::MessageTimer>::shared_ptr((shared_ptr<helics::MessageTimer> *)0x59ee4a);
  gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  BlockingQueue((BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)
                CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  gmlc::containers::
  BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
  ::BlockingQueue((BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
                   *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  std::atomic<unsigned_short>::atomic
            ((atomic<unsigned_short> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)
             ,CONCAT11(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe5e));
  std::
  map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
  ::map((map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
         *)0x59eeab);
  lVar3 = in_RDI + 0x4c0;
  std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::vector
            ((vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> *)0x59eec4);
  this_01 = (FederateState *)(in_RDI + 0x4d8);
  std::vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_>::vector
            ((vector<helics::InterfaceHandle,_std::allocator<helics::InterfaceHandle>_> *)0x59eedd);
  std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::vector
            ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)0x59eef6
            );
  *(undefined8 *)(in_RDI + 0x508) = 0x8000000000000001;
  *(undefined8 *)(in_RDI + 0x510) = 0x8000000000000001;
  *(undefined8 *)(in_RDI + 0x518) = 0x8000000000000001;
  memset((void *)(in_RDI + 0x520),0,1);
  std::atomic_flag::atomic_flag((atomic_flag *)0x59ef4a);
  std::
  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
  ::vector((vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
            *)0x59ef63);
  std::shared_ptr<helics::FederateOperator>::shared_ptr
            ((shared_ptr<helics::FederateOperator> *)0x59ef7c);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x59ef95);
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (bool)in_stack_fffffffffffffe5f);
  local_60 = local_18;
  local_68._M_current =
       (pair<int,_TimeRepresentation<count_time<9,_long>_>_> *)
       std::
       vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
       ::begin((vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffe5f,
                           CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)));
  local_70 = (pair<int,_TimeRepresentation<count_time<9,_long>_>_> *)
             std::
             vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
             ::end((vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffe5f,
                               CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)));
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_*,_std::vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>_>
                      ((__normal_iterator<const_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_*,_std::vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       (__normal_iterator<const_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_*,_std::vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe5f,
                                   CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_78 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_*,_std::vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>_>
               ::operator*(&local_68);
    local_80 = (local_78->second).internalTimeCode;
    setProperty(in_stack_00000048,in_stack_00000044,in_stack_00000050);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_*,_std::vector<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>_>
    ::operator++(&local_68);
  }
  local_88 = local_18 + 0x18;
  local_90._M_current =
       (pair<int,_int> *)
       std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                 ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                  CONCAT17(in_stack_fffffffffffffe5f,
                           CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)));
  local_98 = (pair<int,_int> *)
             std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        CONCAT17(in_stack_fffffffffffffe5f,
                                 CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)));
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      ((__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       (__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe5f,
                                   CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_a0 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator*(&local_90);
    setProperty(this_01,(int)((ulong)lVar3 >> 0x20),(int)lVar3);
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&local_90);
  }
  local_a8 = local_18 + 0x30;
  local_b0._M_current =
       (pair<int,_bool> *)
       std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::begin
                 ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                  CONCAT17(in_stack_fffffffffffffe5f,
                           CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)));
  local_b8 = (pair<int,_bool> *)
             std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>::end
                       ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                        CONCAT17(in_stack_fffffffffffffe5f,
                                 CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)));
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
                      ((__normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       (__normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffe5f,
                                   CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_c0 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
               ::operator*(&local_b0);
    setOptionFlag(in_stack_fffffffffffffe70,(int)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                  SUB81((ulong)in_stack_fffffffffffffe68 >> 0x18,0));
    __gnu_cxx::
    __normal_iterator<const_std::pair<int,_bool>_*,_std::vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_>_>
    ::operator++(&local_b0);
  }
  this_00 = std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::
            operator->((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_> *)
                       0x59f26b);
  std::function<void(helics::ActionMessage&&)>::
  function<helics::FederateState::FederateState(std::__cxx11::string_const&,helics::CoreFederateInfo_const&)::__1,void>
            (&local_e0,(anon_class_8_1_8991fb9c *)this_00);
  LogManager::setTransmitCallback
            ((LogManager *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
             (function<void_(helics::ActionMessage_&&)> *)
             CONCAT17(in_stack_fffffffffffffe5f,
                      CONCAT16(in_stack_fffffffffffffe5e,in_stack_fffffffffffffe58)));
  std::function<void_(helics::ActionMessage_&&)>::~function
            ((function<void_(helics::ActionMessage_&&)> *)0x59f2bb);
  std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::operator->
            ((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_> *)0x59f2cf);
  iVar2 = LogManager::getMaxLevel(this_00);
  *(int *)(in_RDI + 0x290) = iVar2;
  return;
}

Assistant:

FederateState::FederateState(const std::string& fedName, const CoreFederateInfo& fedInfo):
    name(fedName),
    timeCoord(new TimeCoordinator([this](const ActionMessage& msg) { routeMessage(msg); })),
    global_id{GlobalFederateId()}, mLogManager(std::make_unique<LogManager>())
{
    for (const auto& prop : fedInfo.timeProps) {
        setProperty(prop.first, prop.second);
    }
    for (const auto& prop : fedInfo.intProps) {
        setProperty(prop.first, prop.second);
    }
    for (const auto& prop : fedInfo.flagProps) {
        setOptionFlag(prop.first, prop.second);
    }
    mLogManager->setTransmitCallback(
        [this](ActionMessage&& message) { mParent->addActionMessage(std::move(message)); });
    maxLogLevel = mLogManager->getMaxLevel();
}